

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_cfgable.c
# Opt level: O2

void config_init(OperationConfig *config)

{
  memset(config,0,0x4c0);
  config->postfieldsize = -1;
  config->create_dirs = false;
  config->maxredirs = 0x32;
  config->proto = -1;
  config->proto_redir = -0xc000411;
  config->proto_default = (char *)0x0;
  config->tcp_nodelay = true;
  config->happy_eyeballs_timeout_ms = 200;
  config->http09_allowed = true;
  return;
}

Assistant:

void config_init(struct OperationConfig* config)
{
  memset(config, 0, sizeof(struct OperationConfig));

  config->postfieldsize = -1;
  config->use_httpget = FALSE;
  config->create_dirs = FALSE;
  config->maxredirs = DEFAULT_MAXREDIRS;
  config->proto = CURLPROTO_ALL;
  config->proto_present = FALSE;
  config->proto_redir = CURLPROTO_ALL & /* All except FILE, SCP and SMB */
    ~(CURLPROTO_FILE | CURLPROTO_SCP | CURLPROTO_SMB |
      CURLPROTO_SMBS);
  config->proto_redir_present = FALSE;
  config->proto_default = NULL;
  config->tcp_nodelay = TRUE; /* enabled by default */
  config->happy_eyeballs_timeout_ms = CURL_HET_DEFAULT;
  config->http09_allowed = TRUE;
}